

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)7>::~BlockExprBase(BlockExprBase<(wabt::ExprType)7> *this)

{
  ~BlockExprBase(this);
  operator_delete(this);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}